

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_resolve.cpp
# Opt level: O1

void __thiscall tst_helpers_resolve::voidFuture(tst_helpers_resolve *this)

{
  QSharedData *pQVar1;
  int *piVar2;
  bool bVar3;
  char cVar4;
  byte bVar5;
  int iVar6;
  PromiseData<void> *pPVar7;
  PromiseData<void> *pPVar8;
  PromiseData<void> *pPVar9;
  char *pcVar10;
  char *pcVar11;
  anon_class_1_0_00000001_for__M_head_impl *in_RDX;
  anon_class_1_0_00000001_for__M_head_impl *f;
  long lVar12;
  QtConcurrent *in_RSI;
  QFutureInterfaceBase *this_00;
  bool bVar13;
  PromiseResolver<void> resolver;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_e0;
  PromiseResolver<void> resolver_1;
  long lStack_d0;
  QPromise<void> local_c8;
  _func_int **local_b8;
  PromiseData<void> *local_b0;
  _func_int **local_a8;
  PromiseData<void> *local_a0;
  PromiseData<void> *local_98;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_90;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_88;
  PromiseData<void> *local_80;
  _func_int **local_78;
  QSharedData *local_70;
  QSharedData *local_68;
  QSharedData *local_60;
  PromiseData<void> *local_58;
  QFuture<void> v1;
  QFuture<void> v0;
  
  this_00 = &v0.d;
  QtConcurrent::run<tst_helpers_resolve::voidFuture()::__0&>((QFuture<void> *)this_00,in_RSI,in_RDX)
  ;
  QFutureInterfaceBase::QFutureInterfaceBase(&v1.d,this_00);
  QtConcurrent::run<tst_helpers_resolve::voidFuture()::__0&>
            ((QFuture<void> *)&resolver_1,(QtConcurrent *)this_00,f);
  pPVar7 = (PromiseData<void> *)operator_new(0x58);
  (pPVar7->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&(pPVar7->super_PromiseDataBase<void,_void_()>).super_QSharedData = 0;
  (pPVar7->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar7->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
  (pPVar7->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
  (pPVar7->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
  (pPVar7->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
  (pPVar7->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(pPVar7->super_PromiseDataBase<void,_void_()>).m_lock = 0;
  *(undefined8 *)&(pPVar7->super_PromiseDataBase<void,_void_()>).m_settled = 0;
  (pPVar7->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object = (void *)0x0;
  (pPVar7->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_00124528;
  QReadWriteLock::QReadWriteLock(&(pPVar7->super_PromiseDataBase<void,_void_()>).m_lock,0);
  (pPVar7->super_PromiseDataBase<void,_void_()>).m_settled = false;
  (pPVar7->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
  (pPVar7->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (pPVar7->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
  (pPVar7->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
  (pPVar7->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar7->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
  (pPVar7->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object = (void *)0x0;
  (pPVar7->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_001244b0;
  LOCK();
  pQVar1 = &(pPVar7->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  pQVar1 = &(pPVar7->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_60 = &(pPVar7->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  local_78 = (_func_int **)&PTR__QPromiseBase_00124448;
  local_c8.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00124448;
  local_c8.super_QPromiseBase<void>.m_d.d = pPVar7;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver,&local_c8);
  local_c8.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00124490;
  if (local_c8.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((local_c8.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (local_c8.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0)) {
      (*((local_c8.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
        _vptr_PromiseDataBase[1])();
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_e0 = resolver.m_d.d;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  local_90 = resolver.m_d.d;
  QtPromisePrivate::PromiseFulfill<QFuture<void>_>::call
            ((QFuture<void> *)&resolver_1,(QPromiseResolve<void> *)&local_e0,
             (QPromiseReject<void> *)&local_90);
  if (local_90.d != (Data *)0x0) {
    LOCK();
    ((local_90.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_90.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((local_90.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
       (local_90.d != (Data *)0x0)) {
      operator_delete(local_90.d,0x10);
    }
  }
  if (local_e0.d != (Data *)0x0) {
    LOCK();
    ((local_e0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          ((local_e0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if (((__int_type)
         ((local_e0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) &&
       (local_e0.d != (Data *)0x0)) {
      operator_delete(local_e0.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver.m_d.d == 0) && (resolver.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  QFutureInterfaceBase::~QFutureInterfaceBase((QFutureInterfaceBase *)&resolver_1);
  local_98 = pPVar7;
  pPVar8 = (PromiseData<void> *)operator_new(0x58);
  (pPVar8->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&(pPVar8->super_PromiseDataBase<void,_void_()>).super_QSharedData = 0;
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(pPVar8->super_PromiseDataBase<void,_void_()>).m_lock = 0;
  *(undefined8 *)&(pPVar8->super_PromiseDataBase<void,_void_()>).m_settled = 0;
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object = (void *)0x0;
  (pPVar8->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_00124528;
  QReadWriteLock::QReadWriteLock(&(pPVar8->super_PromiseDataBase<void,_void_()>).m_lock,0);
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_settled = false;
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
  (pPVar8->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object = (void *)0x0;
  (pPVar8->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_001244b0;
  LOCK();
  pQVar1 = &(pPVar8->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_68 = &(pPVar8->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  LOCK();
  pQVar1 = &(pPVar8->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_c8.super_QPromiseBase<void>._vptr_QPromiseBase = local_78;
  local_c8.super_QPromiseBase<void>.m_d.d = pPVar8;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver_1,&local_c8);
  local_c8.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00124490;
  if (local_c8.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((local_c8.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (local_c8.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0)) {
      (*((local_c8.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
        _vptr_PromiseDataBase[1])();
    }
  }
  resolver.m_d.d._4_4_ = resolver_1.m_d.d._4_4_;
  resolver.m_d.d._0_4_ = resolver_1.m_d.d._0_4_;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_88.d = (Data *)CONCAT44(resolver_1.m_d.d._4_4_,resolver_1.m_d.d._0_4_);
  if (local_88.d != (Data *)0x0) {
    LOCK();
    ((local_88.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_88.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QtPromisePrivate::PromiseFulfill<QFuture<void>_>::call
            (&v0,(QPromiseResolve<void> *)&resolver,(QPromiseReject<void> *)&local_88);
  if (local_88.d != (Data *)0x0) {
    LOCK();
    ((local_88.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_88.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((local_88.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
       (local_88.d != (Data *)0x0)) {
      operator_delete(local_88.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver.m_d.d == 0) && (resolver.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  piVar2 = (int *)CONCAT44(resolver_1.m_d.d._4_4_,resolver_1.m_d.d._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if ((*piVar2 == 0) &&
       ((void *)CONCAT44(resolver_1.m_d.d._4_4_,resolver_1.m_d.d._0_4_) != (void *)0x0)) {
      operator_delete((void *)CONCAT44(resolver_1.m_d.d._4_4_,resolver_1.m_d.d._0_4_),0x10);
    }
  }
  local_80 = pPVar8;
  pPVar9 = (PromiseData<void> *)operator_new(0x58);
  (pPVar9->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&(pPVar9->super_PromiseDataBase<void,_void_()>).super_QSharedData = 0;
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(pPVar9->super_PromiseDataBase<void,_void_()>).m_lock = 0;
  *(undefined8 *)&(pPVar9->super_PromiseDataBase<void,_void_()>).m_settled = 0;
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object = (void *)0x0;
  (pPVar9->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_00124528;
  QReadWriteLock::QReadWriteLock(&(pPVar9->super_PromiseDataBase<void,_void_()>).m_lock,0);
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_settled = false;
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
  (pPVar9->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object = (void *)0x0;
  (pPVar9->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_001244b0;
  LOCK();
  pQVar1 = &(pPVar9->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_70 = &(pPVar9->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  LOCK();
  pQVar1 = &(pPVar9->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_c8.super_QPromiseBase<void>._vptr_QPromiseBase = local_78;
  local_c8.super_QPromiseBase<void>.m_d.d = pPVar9;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver_1,&local_c8);
  local_c8.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00124490;
  if (local_c8.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((local_c8.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (local_c8.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0)) {
      (*((local_c8.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
        _vptr_PromiseDataBase[1])();
    }
  }
  resolver.m_d.d._4_4_ = resolver_1.m_d.d._4_4_;
  resolver.m_d.d._0_4_ = resolver_1.m_d.d._0_4_;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_e0.d = (Data *)CONCAT44(resolver_1.m_d.d._4_4_,resolver_1.m_d.d._0_4_);
  if (local_e0.d != (Data *)0x0) {
    LOCK();
    ((local_e0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_e0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QtPromisePrivate::PromiseFulfill<QFuture<void>_>::call
            (&v1,(QPromiseResolve<void> *)&resolver,(QPromiseReject<void> *)&local_e0);
  if (local_e0.d != (Data *)0x0) {
    LOCK();
    ((local_e0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_e0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((local_e0.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
       (local_e0.d != (Data *)0x0)) {
      operator_delete(local_e0.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if ((*(int *)resolver.m_d.d == 0) && (resolver.m_d.d != (Data *)0x0)) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  piVar2 = (int *)CONCAT44(resolver_1.m_d.d._4_4_,resolver_1.m_d.d._0_4_);
  if (piVar2 != (int *)0x0) {
    LOCK();
    *piVar2 = *piVar2 + -1;
    UNLOCK();
    if ((*piVar2 == 0) &&
       ((void *)CONCAT44(resolver_1.m_d.d._4_4_,resolver_1.m_d.d._0_4_) != (void *)0x0)) {
      operator_delete((void *)CONCAT44(resolver_1.m_d.d._4_4_,resolver_1.m_d.d._0_4_),0x10);
    }
  }
  local_c8.super_QPromiseBase<void>.m_d.d = pPVar7;
  LOCK();
  pQVar1 = &(pPVar7->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_c8.super_QPromiseBase<void>._vptr_QPromiseBase = local_78;
  local_b0 = pPVar8;
  LOCK();
  pQVar1 = &(pPVar8->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_b8 = local_78;
  local_a0 = pPVar9;
  LOCK();
  pQVar1 = &(pPVar9->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_a8 = local_78;
  lVar12 = 8;
  bVar13 = false;
  local_58 = pPVar9;
  do {
    bVar3 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                      (*(PromiseDataBase<void,_void_()> **)
                        ((long)&local_c8.super_QPromiseBase<void>._vptr_QPromiseBase + lVar12));
    resolver_1.m_d.d._0_1_ = bVar3;
    resolver.m_d.d._0_1_ = 1;
    pcVar10 = QTest::toString<bool>((bool *)&resolver_1);
    pcVar11 = QTest::toString<bool>((bool *)&resolver);
    cVar4 = QTest::compare_helper
                      (bVar3,"Compared values are not the same",pcVar10,pcVar11,
                       "promise.isPending()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_resolve.cpp"
                       ,0x10e);
    pPVar8 = local_80;
    pPVar7 = local_98;
    if (cVar4 == '\0') break;
    lVar12 = lVar12 + 0x10;
    bVar13 = lVar12 == 0x38;
  } while (!bVar13);
  lVar12 = 0x30;
  do {
    *(undefined ***)((long)&resolver_1.m_d.d + lVar12) = &PTR__QPromiseBase_00124490;
    if (*(long *)((long)&lStack_d0 + lVar12) != 0) {
      LOCK();
      piVar2 = (int *)(*(long *)((long)&lStack_d0 + lVar12) + 8);
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if ((*piVar2 == 0) && (*(long **)((long)&lStack_d0 + lVar12) != (long *)0x0)) {
        (**(code **)(**(long **)((long)&lStack_d0 + lVar12) + 8))();
      }
    }
    lVar12 = lVar12 + -0x10;
  } while (lVar12 != 0);
  pPVar9 = local_58;
  if (bVar13) {
    local_c8.super_QPromiseBase<void>.m_d.d = pPVar7;
    LOCK();
    pQVar1 = &(pPVar7->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_c8.super_QPromiseBase<void>._vptr_QPromiseBase = local_78;
    local_b0 = pPVar8;
    LOCK();
    pQVar1 = &(pPVar8->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_b8 = local_78;
    local_a0 = local_58;
    LOCK();
    pQVar1 = &(local_58->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_a8 = local_78;
    lVar12 = 0;
    do {
      resolver_1.m_d.d._0_4_ = 0xffffffff;
      resolver.m_d.d._0_4_ = 0x2a;
      iVar6 = waitForValue<int>((QPromise<void> *)
                                ((long)&local_c8.super_QPromiseBase<void>._vptr_QPromiseBase +
                                lVar12),(int *)&resolver_1,(int *)&resolver);
      bVar5 = QTest::qCompare(iVar6,0x2a,"waitForValue(promise, -1, 42)","42",
                              "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_resolve.cpp"
                              ,0x111);
      pPVar9 = local_58;
      pPVar8 = local_80;
      pPVar7 = local_98;
      bVar13 = lVar12 != 0x20;
      lVar12 = lVar12 + 0x10;
    } while ((bVar5 & bVar13) != 0);
    lVar12 = 0x30;
    do {
      *(undefined ***)((long)&resolver_1.m_d.d + lVar12) = &PTR__QPromiseBase_00124490;
      if (*(long *)((long)&lStack_d0 + lVar12) != 0) {
        LOCK();
        piVar2 = (int *)(*(long *)((long)&lStack_d0 + lVar12) + 8);
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if ((*piVar2 == 0) && (*(long **)((long)&lStack_d0 + lVar12) != (long *)0x0)) {
          (**(code **)(**(long **)((long)&lStack_d0 + lVar12) + 8))();
        }
      }
      lVar12 = lVar12 + -0x10;
    } while (lVar12 != 0);
  }
  LOCK();
  (local_70->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (local_70->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((local_70->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*(pPVar9->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase[1])(pPVar9);
  }
  LOCK();
  (local_68->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (local_68->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((local_68->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*(pPVar8->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase[1])(pPVar8);
  }
  LOCK();
  (local_60->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (local_60->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((local_60->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*(pPVar7->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase[1])(pPVar7);
  }
  QFutureInterfaceBase::~QFutureInterfaceBase(&v1.d);
  QFutureInterfaceBase::~QFutureInterfaceBase(&v0.d);
  return;
}

Assistant:

void tst_helpers_resolve::voidFuture()
{
    auto fn = []() {};
    QFuture<void> v0 = QtConcurrent::run(fn);
    const QFuture<void> v1 = v0;

    auto p0 = QtPromise::resolve(QtConcurrent::run(fn));
    auto p1 = QtPromise::resolve(v0);
    auto p2 = QtPromise::resolve(v1);

    Q_STATIC_ASSERT((std::is_same<decltype(p0), QtPromise::QPromise<void>>::value));
    Q_STATIC_ASSERT((std::is_same<decltype(p1), QtPromise::QPromise<void>>::value));
    Q_STATIC_ASSERT((std::is_same<decltype(p2), QtPromise::QPromise<void>>::value));

    for (const auto& promise : {p0, p1, p2}) {
        QCOMPARE(promise.isPending(), true);
    }
    for (const auto& promise : {p0, p1, p2}) {
        QCOMPARE(waitForValue(promise, -1, 42), 42);
    }
}